

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

QAccessibleInterface * __thiscall QAccessibleMenuItem::child(QAccessibleMenuItem *this,int index)

{
  QMenu *pQVar1;
  QObject *pQVar2;
  QAccessibleInterface *pQVar3;
  
  if (index == 0) {
    pQVar1 = QAction::menu<QMenu*>(this->m_action);
    if (pQVar1 != (QMenu *)0x0) {
      pQVar2 = (QObject *)QAction::menu<QMenu*>(this->m_action);
      pQVar3 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar2);
      return pQVar3;
    }
  }
  return (QAccessibleInterface *)0x0;
}

Assistant:

QAccessibleInterface *QAccessibleMenuItem::child(int index) const
{
    if (index == 0 && action()->menu())
        return QAccessible::queryAccessibleInterface(action()->menu());
    return nullptr;
}